

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderControlStatementTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Performance::LoopWorkloadReferenceCase::writeWorkload
          (LoopWorkloadReferenceCase *this,ostringstream *dst,char *resultVariableName,
          char *inputVariableName)

{
  PerfCaseType PVar1;
  ostream *poVar2;
  int iVar3;
  bool bVar4;
  
  PVar1 = (this->super_WorkloadReferenceCase).super_ControlStatementCase.super_ShaderPerformanceCase
          .m_caseType;
  poVar2 = std::operator<<(&dst->super_basic_ostream<char,_std::char_traits<char>_>,"\t");
  poVar2 = std::operator<<(poVar2,resultVariableName);
  std::operator<<(poVar2," = vec4(0.0);\n");
  iVar3 = 0xb;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    std::operator<<(&dst->super_basic_ostream<char,_std::char_traits<char>_>,"\t");
    writeLoopWorkload(dst,resultVariableName,inputVariableName);
    std::operator<<(&dst->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  }
  if ((PVar1 != CASETYPE_VERTEX) && (this->m_isAttributeStable == false)) {
    std::operator<<(&dst->super_basic_ostream<char,_std::char_traits<char>_>,
                    "\tres.x = fract(res.x);\n");
    return;
  }
  return;
}

Assistant:

void LoopWorkloadReferenceCase::writeWorkload (std::ostringstream& dst, const char* resultVariableName, const char* inputVariableName) const
{
	const int	loopIterations	= 11;
	bool		isVertexCase	= m_caseType == CASETYPE_VERTEX;

	dst << "\t" << resultVariableName << " = vec4(0.0);\n";

	for (int i = 0; i < loopIterations; i++)
	{
		dst << "\t";
		writeLoopWorkload(dst, resultVariableName, inputVariableName);
		dst << "\n";
	}

	if (!isVertexCase && !m_isAttributeStable)
	{
		// Corresponds to the fract() done in a real test's fragment case with non-stable attribute.
		dst << "	res.x = fract(res.x);\n";
	}
}